

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

UINT16 TPML_DIGEST_Marshal(TPML_DIGEST *source,BYTE **buffer,INT32 *size)

{
  UINT16 UVar1;
  short sVar2;
  long lVar3;
  TPM2B_DIGEST *source_00;
  
  UINT32_Marshal(&source->count,buffer,size);
  lVar3 = (long)(int)source->count;
  if (lVar3 < 1) {
    UVar1 = 4;
  }
  else {
    source_00 = source->digests;
    sVar2 = 0;
    do {
      UVar1 = TPM2B_DIGEST_Marshal(source_00,buffer,size);
      sVar2 = sVar2 + UVar1;
      source_00 = source_00 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    UVar1 = sVar2 + 4;
  }
  return UVar1;
}

Assistant:

UINT16
TPML_DIGEST_Marshal(TPML_DIGEST *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + UINT32_Marshal((UINT32 *)&(source->count), buffer, size));
    result = (UINT16)(result + TPM2B_DIGEST_Array_Marshal((TPM2B_DIGEST *)(source->digests), buffer, size, (INT32)(source->count)));
    return result;
}